

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbengine.cpp
# Opt level: O0

bool __thiscall banksia::WbEngine::stop(WbEngine *this)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *__buf;
  Engine *in_RDI;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"force",&local_29);
  sVar1 = Engine::write(in_RDI,(int)local_28,__buf,in_RCX);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return (bool)((byte)sVar1 & 1);
}

Assistant:

bool WbEngine::stop()
{
    return write("force");
}